

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseOutputCommand(WastParser *this,CommandPtr *param_1)

{
  bool bVar1;
  Result RVar2;
  TokenType TVar3;
  Location local_160;
  Var local_140;
  undefined1 local_f8 [8];
  string text;
  undefined1 local_b8 [8];
  Var var;
  undefined1 local_48 [8];
  Location loc;
  CommandPtr *param_1_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  RVar2 = Expect(this,Output);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  var.field_2._24_8_ = local_48;
  Error(this,0x3487b8);
  Location::Location((Location *)((long)&text.field_2 + 8));
  Var::Var((Var *)local_b8,0xffffffff,(Location *)((long)&text.field_2 + 8));
  std::__cxx11::string::string((string *)local_f8);
  Location::Location(&local_160);
  Var::Var(&local_140,0xffffffff,&local_160);
  ParseVarOpt(this,(Var *)local_b8,&local_140);
  Var::~Var(&local_140);
  TVar3 = Peek(this,0);
  if (TVar3 == Text) {
    RVar2 = ParseQuotedText(this,(string *)local_f8);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_002b0d82;
    }
  }
  RVar2 = Expect(this,Rpar);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
LAB_002b0d82:
  std::__cxx11::string::~string((string *)local_f8);
  Var::~Var((Var *)local_b8);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseOutputCommand(CommandPtr*) {
  // Parse the output command, but always fail since this command is not
  // actually supported.
  WABT_TRACE(ParseOutputCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Output);
  Error(loc, "output command is not supported");
  Var var;
  std::string text;
  ParseVarOpt(&var);
  if (Peek() == TokenType::Text) {
    CHECK_RESULT(ParseQuotedText(&text));
  }
  EXPECT(Rpar);
  return Result::Error;
}